

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_13,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  float scalar;
  undefined4 uVar6;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in0;
  float afStack_110 [6];
  float local_f8 [4];
  float local_e8 [2];
  ulong local_e0;
  undefined4 local_d8;
  float local_d0 [4];
  float local_c0 [4];
  float local_b0 [6];
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_50;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_98;
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_98.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_98.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_98.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_98.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_98.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_98.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    pfVar1 = (float *)&local_98;
    local_98.m_data.m_data[3].m_data[0] = 0.0;
    local_98.m_data.m_data[3].m_data[1] = 0.0;
    local_98.m_data.m_data[3].m_data[2] = 0.0;
    local_98.m_data.m_data[3].m_data[3] = 0.0;
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    local_98.m_data.m_data[2].m_data[2] = 0.0;
    local_98.m_data.m_data[2].m_data[3] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[3] = 0.0;
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[2] = 0.0;
    local_98.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = (float)*(undefined4 *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    scalar = (evalCtx->coords).m_data[0];
  }
  else {
    scalar = -0.2;
  }
  afStack_110[0] = 8.384039e-39;
  afStack_110[1] = 0.0;
  tcu::operator/(&local_50,&local_98,scalar);
  local_b0[0] = local_50.m_data.m_data[0].m_data[0];
  local_b0[1] = local_50.m_data.m_data[0].m_data[1];
  local_b0[2] = local_50.m_data.m_data[0].m_data[2];
  local_c0[0] = local_50.m_data.m_data[1].m_data[1];
  local_c0[1] = local_50.m_data.m_data[1].m_data[2];
  local_c0[2] = local_50.m_data.m_data[1].m_data[3];
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  lVar2 = 0;
  do {
    local_f8[lVar2] = local_b0[lVar2] + local_c0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_d0[0] = local_50.m_data.m_data[2].m_data[2];
  local_d0[1] = local_50.m_data.m_data[2].m_data[3];
  local_d0[2] = local_50.m_data.m_data[2].m_data[0];
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e0 = local_e0 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    local_e8[lVar2] = local_f8[lVar2] + local_d0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b0[3] = local_50.m_data.m_data[3].m_data[3];
  local_b0[4] = local_50.m_data.m_data[3].m_data[0];
  local_b0[5] = local_50.m_data.m_data[3].m_data[1];
  afStack_110[2] = 0.0;
  afStack_110[3] = 0.0;
  afStack_110[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_110[lVar2 + 2] = local_e8[lVar2] + local_b0[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_e0 = 0x100000000;
  local_d8 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_e8[lVar2]] = afStack_110[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}